

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O1

bool Rml::XMLParseTools::ReadAttribute(char **string,String *name,String *value)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  byte *pbVar6;
  
  pbVar6 = (byte *)*string;
  ::std::__cxx11::string::_M_replace((ulong)name,0,(char *)name->_M_string_length,0x2e2a1c);
  ::std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,0x2e2a1c);
  while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
  }
  bVar3 = *pbVar6;
  if (1 < (byte)(bVar3 - 0x3d)) {
    bVar4 = false;
    do {
      if (bVar4) {
        if (0x3e < bVar3) goto LAB_002a21cc;
        uVar5 = (ulong)bVar3;
        bVar2 = true;
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 == 0x3d) goto LAB_002a2230;
          if (uVar5 != 0x3e) goto LAB_002a21cc;
          goto LAB_002a22b6;
        }
      }
      else if ((0x20 < bVar3) || (bVar2 = true, (0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
        ::std::__cxx11::string::push_back((char)name);
        bVar2 = bVar4;
      }
      bVar4 = bVar2;
      bVar3 = pbVar6[1];
      pbVar6 = pbVar6 + 1;
    } while (1 < (byte)(bVar3 - 0x3d));
  }
  if (bVar3 == 0x3d) {
LAB_002a2230:
    bVar3 = 0;
    for (; uVar5 = (ulong)*pbVar6, uVar5 < 0x3f; pbVar6 = pbVar6 + 1) {
      if ((0x2000000100002600U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x8400000000U >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 == 0x3e) goto LAB_002a226b;
          break;
        }
        bVar3 = 1;
      }
    }
    do {
      bVar1 = *pbVar6;
      if ((bVar1 == 0x22) || (bVar1 == 0x27)) goto LAB_002a229e;
      if (bVar1 == 0x3e) goto LAB_002a226b;
      if (!(bool)(bVar1 != 0x20 | bVar3)) goto LAB_002a229e;
      pbVar6 = pbVar6 + 1;
      ::std::__cxx11::string::push_back((char)value);
    } while( true );
  }
  if (bVar3 == 0x3e) goto LAB_002a22b6;
LAB_002a21cc:
  pbVar6 = pbVar6 + -1;
  goto LAB_002a22af;
LAB_002a226b:
  bVar4 = false;
  goto LAB_002a22ab;
LAB_002a229e:
  pbVar6 = pbVar6 + bVar3;
  bVar4 = true;
LAB_002a22ab:
  if (bVar4) {
LAB_002a22af:
    *string = (char *)pbVar6;
    bVar4 = true;
  }
  else {
LAB_002a22b6:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool XMLParseTools::ReadAttribute(const char*& string, String& name, String& value)
{
	const char* ptr = string;

	name = "";
	value = "";

	// Skip whitespace
	while (StringUtilities::IsWhitespace(*ptr))
		ptr++;

	// Look for the end of the attribute name
	bool found_whitespace = false;
	while (*ptr != '=' && *ptr != '>' && (!found_whitespace || StringUtilities::IsWhitespace(*ptr)))
	{
		if (StringUtilities::IsWhitespace(*ptr))
			found_whitespace = true;
		else
			name += *ptr;
		ptr++;
	}
	if (*ptr == '>')
		return false;

	// If we stopped on an equals, parse the value
	if (*ptr == '=')
	{
		// Skip over white space, ='s and quotes
		bool quoted = false;
		while (StringUtilities::IsWhitespace(*ptr) || *ptr == '\'' || *ptr == '"' || *ptr == '=')
		{
			if (*ptr == '\'' || *ptr == '"')
				quoted = true;
			ptr++;
		}
		if (*ptr == '>')
			return false;

		// Store the value
		while (*ptr != '\'' && *ptr != '"' && *ptr != '>' && (*ptr != ' ' || quoted))
		{
			value += *ptr++;
		}
		if (*ptr == '>')
			return false;

		// Advance passed the quote
		if (quoted)
			ptr++;
	}
	else
	{
		ptr--;
	}

	// Update the string pointer
	string = ptr;

	return true;
}